

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Proto3PackedDynamicExtensions_Test::
TestBody(ExtensionSetTest_Proto3PackedDynamicExtensions_Test *this)

{
  string *psVar1;
  bool bVar2;
  Descriptor *pDVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this_00;
  DescriptorPool *underlay;
  Arena *pAVar4;
  InternalMetadata IVar5;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar6;
  char *in_R9;
  string_view value;
  AssertHelper local_328;
  AssertionResult gtest_ar__2;
  AssertHelper local_310;
  string reserialized_options;
  AssertionResult gtest_ar__1;
  UnknownFieldSet unknown_fields;
  ArrayInputStream input_stream;
  string serialized_options;
  MessageOptions message_options;
  CodedInputStream coded_stream;
  DynamicMessageFactory factory;
  DescriptorPool pool;
  FileDescriptorProto file_descriptor_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_descriptor_proto);
  file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  IVar5 = file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_;
  if ((file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar5.ptr_ = *(undefined8 *)
                  (file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&file_descriptor_proto.field_0._impl_.syntax_,"proto3",(Arena *)IVar5.ptr_);
  file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar5 = file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_;
  if ((file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar5.ptr_ = *(undefined8 *)
                  (file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&file_descriptor_proto.field_0._impl_.name_,
                      "google/protobuf/unittest_proto3_packed_extension.proto",(Arena *)IVar5.ptr_);
  file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       file_descriptor_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&file_descriptor_proto.field_0._impl_.package_,"proto3_unittest",
                      (Arena *)file_descriptor_proto.super_Message.super_MessageLite.
                               _internal_metadata_.ptr_);
  pDVar3 = DescriptorProto::GetDescriptor();
  psVar1 = pDVar3->file_->name_;
  pool.field_memo_table_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>,_true,_true>
        )(psVar1->_M_dataplus)._M_p;
  pool.field_memo_table_mutex_.mu_.super___atomic_base<long>._M_i =
       (atomic<long>)psVar1->_M_string_length;
  AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
            (&file_descriptor_proto.field_0._impl_.dependency_,
             (basic_string_view<char,_std::char_traits<char>_> *)&pool);
  this_00 = RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                      (&file_descriptor_proto.field_0._impl_.extension_.super_RepeatedPtrFieldBase);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 1;
  pAVar4 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"repeated_int32_option",pAVar4);
  MessageOptions::MessageOptions((MessageOptions *)&pool);
  value = MessageLite::GetTypeName((MessageLite *)&pool);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 2;
  pAVar4 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&(this_00->field_0)._impl_.extendee_,value,pAVar4);
  MessageOptions::~MessageOptions((MessageOptions *)&pool);
  (this_00->field_0)._impl_.number_ = 0xc359;
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 0x40;
  FieldDescriptorProto::set_label(this_00,FieldDescriptorProto_Label_LABEL_REPEATED);
  FieldDescriptorProto::set_type(this_00,FieldDescriptorProto_Type_TYPE_INT32);
  *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 0x10;
  pAVar4 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&(this_00->field_0)._impl_.json_name_,"repeatedInt32Option",pAVar4);
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool(&pool,underlay);
  coded_stream.buffer_ = (uint8_t *)DescriptorPool::BuildFile(&pool,&file_descriptor_proto);
  factory.super_MessageFactory._vptr_MessageFactory = (_func_int **)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)&message_options,"pool.BuildFile(file_descriptor_proto)","nullptr",
             (FileDescriptor **)&coded_stream,(void **)&factory);
  if ((char)message_options.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&coded_stream);
    if (message_options.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)message_options.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x55e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory,(Message *)&coded_stream);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory);
    if (coded_stream.buffer_ != (uint8_t *)0x0) {
      (**(code **)(*(long *)coded_stream.buffer_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message_options.super_Message.super_MessageLite._internal_metadata_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message_options.super_Message.super_MessageLite._internal_metadata_);
    DynamicMessageFactory::DynamicMessageFactory(&factory);
    factory.delegate_to_generated_factory_ = true;
    unknown_fields.fields_.soo_rep_.field_0.long_rep.elements_int = 0;
    unknown_fields.fields_.soo_rep_.field_0.short_rep.field_1 =
         (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    UnknownFieldSet::AddVarint(&unknown_fields,0xc359,1);
    serialized_options._M_dataplus._M_p = (pointer)&serialized_options.field_2;
    serialized_options._M_string_length = 0;
    serialized_options.field_2._M_local_buf[0] = '\0';
    bVar2 = UnknownFieldSet::SerializeToString(&unknown_fields,&serialized_options);
    coded_stream.buffer_ = (uint8_t *)CONCAT71(coded_stream.buffer_._1_7_,bVar2);
    coded_stream.buffer_end_ = (uint8_t *)0x0;
    if (bVar2) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&coded_stream.buffer_end_);
      io::ArrayInputStream::ArrayInputStream
                (&input_stream,serialized_options._M_dataplus._M_p,
                 (int)serialized_options._M_string_length,-1);
      io::CodedInputStream::CodedInputStream(&coded_stream,&input_stream.super_ZeroCopyInputStream);
      coded_stream.extension_pool_ = &pool;
      coded_stream.extension_factory_ = &factory.super_MessageFactory;
      MessageOptions::MessageOptions(&message_options);
      gtest_ar__1.success_ =
           MessageLite::ParseFromCodedStream((MessageLite *)&message_options,&coded_stream);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (gtest_ar__1.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        reserialized_options._M_dataplus._M_p = (pointer)&reserialized_options.field_2;
        reserialized_options._M_string_length = 0;
        reserialized_options.field_2._M_local_buf[0] = '\0';
        gtest_ar__2.success_ =
             MessageLite::SerializeToString((MessageLite *)&message_options,&reserialized_options);
        this_01 = &gtest_ar__2.message_;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (gtest_ar__2.success_) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this_01);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                    ((internal *)&gtest_ar__1,"reserialized_options","\"\\xca\\xb5\\x18\\x01\\x01\""
                     ,&reserialized_options,&anon_var_dwarf_651463);
          if (gtest_ar__1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar6 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar6 = *(char **)gtest_ar__1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_328,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x575,pcVar6);
            testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper(&local_328);
            if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
            }
          }
          this_01 = &gtest_ar__1.message_;
        }
        else {
          testing::Message::Message((Message *)&local_328);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1,(internal *)&gtest_ar__2,
                     (AssertionResult *)"message_options.SerializeToString(&reserialized_options)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_310,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x574,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
          testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_328);
          testing::internal::AssertHelper::~AssertHelper(&local_310);
          std::__cxx11::string::~string((string *)&gtest_ar__1);
          if (local_328.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_328.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_01);
        std::__cxx11::string::~string((string *)&reserialized_options);
      }
      else {
        testing::Message::Message((Message *)&gtest_ar__2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&reserialized_options,(internal *)&gtest_ar__1,
                   (AssertionResult *)"message_options.ParseFromCodedStream(&coded_stream)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x56f,reserialized_options._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        std::__cxx11::string::~string((string *)&reserialized_options);
        if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
      }
      MessageOptions::~MessageOptions(&message_options);
      io::CodedInputStream::~CodedInputStream(&coded_stream);
    }
    else {
      testing::Message::Message((Message *)&input_stream);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&message_options,(internal *)&coded_stream,
                 (AssertionResult *)"unknown_fields.SerializeToString(&serialized_options)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&reserialized_options,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x567,(char *)CONCAT71(message_options.super_Message.super_MessageLite.
                                         _vptr_MessageLite._1_7_,
                                         (char)message_options.super_Message.super_MessageLite.
                                               _vptr_MessageLite));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&reserialized_options,(Message *)&input_stream);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&reserialized_options);
      std::__cxx11::string::~string((string *)&message_options);
      if (input_stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream != (_func_int **)0x0) {
        (**(code **)(*input_stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&coded_stream.buffer_end_);
    }
    std::__cxx11::string::~string((string *)&serialized_options);
    UnknownFieldSet::~UnknownFieldSet(&unknown_fields);
    DynamicMessageFactory::~DynamicMessageFactory(&factory);
  }
  DescriptorPool::~DescriptorPool(&pool);
  FileDescriptorProto::~FileDescriptorProto(&file_descriptor_proto);
  return;
}

Assistant:

TEST(ExtensionSetTest, Proto3PackedDynamicExtensions) {
  // Regression test for b/271121265. This test case verifies that
  // packed-by-default repeated custom options in proto3 are correctly
  // serialized in packed form when dynamic extensions are used.

  // Create a custom option in proto3 and load this into an overlay
  // DescriptorPool with a DynamicMessageFactory.
  google::protobuf::FileDescriptorProto file_descriptor_proto;
  file_descriptor_proto.set_syntax("proto3");
  file_descriptor_proto.set_name(
      "google/protobuf/unittest_proto3_packed_extension.proto");
  file_descriptor_proto.set_package("proto3_unittest");
  file_descriptor_proto.add_dependency(
      DescriptorProto::descriptor()->file()->name());
  FieldDescriptorProto* extension = file_descriptor_proto.add_extension();
  extension->set_name("repeated_int32_option");
  extension->set_extendee(MessageOptions().GetTypeName());
  extension->set_number(50009);
  extension->set_label(FieldDescriptorProto::LABEL_REPEATED);
  extension->set_type(FieldDescriptorProto::TYPE_INT32);
  extension->set_json_name("repeatedInt32Option");
  google::protobuf::DescriptorPool pool(DescriptorPool::generated_pool());
  ASSERT_NE(pool.BuildFile(file_descriptor_proto), nullptr);
  DynamicMessageFactory factory;
  factory.SetDelegateToGeneratedFactory(true);

  // Create a serialized MessageOptions proto equivalent to:
  // [proto3_unittest.repeated_int32_option]: 1
  UnknownFieldSet unknown_fields;
  unknown_fields.AddVarint(50009, 1);
  std::string serialized_options;
  ASSERT_TRUE(unknown_fields.SerializeToString(&serialized_options));

  // Parse the MessageOptions using our custom extension registry.
  io::ArrayInputStream input_stream(serialized_options.data(),
                                    serialized_options.size());
  io::CodedInputStream coded_stream(&input_stream);
  coded_stream.SetExtensionRegistry(&pool, &factory);
  MessageOptions message_options;
  ASSERT_TRUE(message_options.ParseFromCodedStream(&coded_stream));

  // Finally, serialize the proto again and verify that the repeated option has
  // been correctly serialized in packed form.
  std::string reserialized_options;
  ASSERT_TRUE(message_options.SerializeToString(&reserialized_options));
  EXPECT_EQ(reserialized_options, "\xca\xb5\x18\x01\x01");
}